

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

void Ree_TruthPrecompute2(void)

{
  word local_18;
  word Truth;
  int b;
  int i;
  
  for (Truth._4_4_ = 0; (int)Truth._4_4_ < 8; Truth._4_4_ = Truth._4_4_ + 1) {
    local_18 = 0xe8;
    for (Truth._0_4_ = 0; (int)Truth < 3; Truth._0_4_ = (int)Truth + 1) {
      if (((int)Truth._4_4_ >> ((byte)(int)Truth & 0x1f) & 1U) != 0) {
        local_18 = Abc_Tt6Flip(local_18,(int)Truth);
      }
    }
    printf("%d = %X\n",(ulong)Truth._4_4_,(ulong)((uint)local_18 & 0xff));
  }
  return;
}

Assistant:

void Ree_TruthPrecompute2()
{
    int i, b;
    for ( i = 0; i < 8; i++ )
    {
        word Truth = 0xE8;
        for ( b = 0; b < 3; b++ )
            if ( (i >> b) & 1 )
                Truth = Abc_Tt6Flip( Truth, b );
        printf( "%d = %X\n", i, 0xFF & (int)Truth );
    }
}